

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  char *pcVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  TestCaseData *local_18;
  TestCaseData *in_local;
  JUnitReporter *this_local;
  
  local_18 = in;
  in_local = (TestCaseData *)this;
  pcVar1 = String::c_str(&in->m_file);
  pcVar1 = skipPathFromFilename(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  pcVar1 = local_18->m_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar1,&local_71);
  JUnitTestCaseData::add(&this->testCaseData,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  detail::Timer::start(&this->timer);
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }